

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

wchar_t cmp_tkill(void *a,void *b)

{
  uint16_t ib;
  uint16_t ia;
  void *b_local;
  void *a_local;
  
  if (l_list[*a].tkills < l_list[*b].tkills) {
    a_local._4_4_ = L'\xffffffff';
  }
  else if (l_list[*b].tkills < l_list[*a].tkills) {
    a_local._4_4_ = L'\x01';
  }
  else {
    a_local._4_4_ = cmp_level(a,b);
  }
  return a_local._4_4_;
}

Assistant:

static int cmp_tkill(const void *a, const void *b)
{
	uint16_t ia = *(const uint16_t *)a;
	uint16_t ib = *(const uint16_t *)b;
	if (l_list[ia].tkills < l_list[ib].tkills)
		return -1;
	if (l_list[ia].tkills > l_list[ib].tkills)
		return 1;
	return cmp_level(a, b);
}